

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>_> __thiscall
kj::
heap<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::NetworkAddress>>
          (kj *this,Own<kj::_::PromiseNode> *params,Own<kj::NetworkAddress> *params_1)

{
  AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_> *this_00;
  Own<kj::_::PromiseNode> *dependency;
  Own<kj::NetworkAddress> *attachment;
  AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>_> OVar1;
  Own<kj::NetworkAddress> *params_local_1;
  Own<kj::_::PromiseNode> *params_local;
  
  this_00 = (AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_> *)operator_new(0x28);
  dependency = fwd<kj::Own<kj::_::PromiseNode>>(params);
  attachment = fwd<kj::Own<kj::NetworkAddress>>(params_1);
  _::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>::AttachmentPromiseNode
            (this_00,dependency,attachment);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>_>::Own
            ((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>_> *)this,this_00,
             (Disposer *)
             &_::HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>>>::instance);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}